

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

lu_mem markbeingfnz(global_State *g)

{
  lu_mem lVar1;
  GCObject *o;
  
  o = g->tobefnz;
  if (o == (GCObject *)0x0) {
    lVar1 = 0;
  }
  else {
    lVar1 = 0;
    do {
      if ((o->marked & 0x18) != 0) {
        reallymarkobject(g,o);
      }
      o = o->next;
      lVar1 = lVar1 + 1;
    } while (o != (GCObject *)0x0);
  }
  return lVar1;
}

Assistant:

static lu_mem markbeingfnz (global_State *g) {
  GCObject *o;
  lu_mem count = 0;
  for (o = g->tobefnz; o != NULL; o = o->next) {
    count++;
    markobject(g, o);
  }
  return count;
}